

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.h
# Opt level: O0

uint8_t * cbor_array_parse<cdns_rr_field>
                    (uint8_t *in,uint8_t *in_max,
                    vector<cdns_rr_field,_std::allocator<cdns_rr_field>_> *v,int *err)

{
  byte bVar1;
  vector<cdns_rr_field,_std::allocator<cdns_rr_field>_> *in_max_00;
  uint8_t *in_00;
  reference v_00;
  bool bVar2;
  bool bVar3;
  int local_3c;
  int rank;
  int is_undef;
  int outer_type;
  int64_t val;
  int *err_local;
  vector<cdns_rr_field,_std::allocator<cdns_rr_field>_> *v_local;
  uint8_t *in_max_local;
  uint8_t *in_local;
  
  bVar1 = *in;
  val = (int64_t)err;
  err_local = (int *)v;
  v_local = (vector<cdns_rr_field,_std::allocator<cdns_rr_field>_> *)in_max;
  in_max_local = in;
  in_max_local = cbor_get_number(in,in_max,(int64_t *)&is_undef);
  if ((in_max_local == (uint8_t *)0x0) || ((int)(uint)bVar1 >> 5 != 4)) {
    *(undefined4 *)val = 0xfffffffd;
    in_max_local = (uint8_t *)0x0;
  }
  else {
    local_3c = 0;
    bVar3 = _is_undef == -1;
    if (bVar3) {
      _is_undef = 0xffffffff;
    }
    while( true ) {
      bVar2 = false;
      if ((local_3c < _is_undef) && (bVar2 = false, in_max_local != (uint8_t *)0x0)) {
        bVar2 = in_max_local < v_local;
      }
      if (!bVar2) {
        return in_max_local;
      }
      if (*in_max_local == 0xff) break;
      std::vector<cdns_rr_field,_std::allocator<cdns_rr_field>_>::resize
                ((vector<cdns_rr_field,_std::allocator<cdns_rr_field>_> *)err_local,
                 (long)local_3c + 1);
      in_00 = in_max_local;
      in_max_00 = v_local;
      v_00 = std::vector<cdns_rr_field,_std::allocator<cdns_rr_field>_>::operator[]
                       ((vector<cdns_rr_field,_std::allocator<cdns_rr_field>_> *)err_local,
                        (long)local_3c);
      in_max_local = cbor_object_parse<cdns_rr_field>(in_00,(uint8_t *)in_max_00,v_00,(int *)val);
      local_3c = local_3c + 1;
    }
    if (bVar3) {
      in_max_local = in_max_local + 1;
    }
    else {
      *(undefined4 *)val = 0xfffffffd;
      in_max_local = (uint8_t *)0x0;
    }
  }
  return in_max_local;
}

Assistant:

uint8_t* cbor_array_parse(uint8_t* in, uint8_t const* in_max, std::vector<InnerClass> * v, int* err)
{
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in == NULL || outer_type != CBOR_T_ARRAY) {
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }
    else {
        int rank = 0;
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }
        
        while (rank < val && in != NULL && in < in_max) {
            if (*in == 0xff) {
                if (is_undef) {
                    in++;
                }
                else {
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                v->resize((size_t)rank + 1); 
                in = cbor_object_parse(in, in_max, &(*v)[rank], err);
                rank++;
            }
        }
    }

    return in;
}